

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O0

int exploration::
    swap_chosen<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
              (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> param_1,
              undefined8 param_2,uint param_3)

{
  bool bVar1;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *this;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __b;
  size_t action_size;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffffc8
  ;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffffd0
  ;
  undefined4 local_4;
  
  bVar1 = __gnu_cxx::operator<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    local_4 = 1;
  }
  else {
    this = (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
           __gnu_cxx::operator-(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (this == (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)0x0) {
      local_4 = 1;
    }
    else if ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
             (ulong)param_3 < this) {
      if (param_3 != 0) {
        __b = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
              operator+(this,param_1._M_current);
        std::
        iter_swap<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                  (param_1,__b);
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int swap_chosen(ActionIt action_first, ActionIt action_last, std::forward_iterator_tag /* action_category */, uint32_t chosen_index)
  {
    if ( action_last < action_first )
      return E_EXPLORATION_BAD_RANGE;

    size_t action_size = action_last - action_first;

    if ( action_size == 0 )
      return E_EXPLORATION_BAD_RANGE;

    if ( chosen_index >= action_size )
      return E_EXPLORATION_BAD_RANGE;

    // swap top element with chosen one
    if ( chosen_index != 0 ) {
      std::iter_swap(action_first, action_first + chosen_index);
    }

    return S_EXPLORATION_OK;
  }